

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

void __thiscall
google::
dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
::
copy_or_move_from<google::dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>const&>
          (dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *this,dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *ht,size_type min_buckets_wanted)

{
  bool bVar1;
  reference args;
  size_type sVar2;
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  pair<int,_int> bucknum_00;
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_RSI;
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_RDI;
  size_type bucket_count_minus_one;
  size_type bucknum;
  size_type num_probes;
  pair<int,_int> *value;
  const_iterator __end0;
  const_iterator __begin0;
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *__range3;
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffff78;
  size_type in_stack_ffffffffffffff88;
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffff90;
  ulong local_68;
  long local_60;
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffffb0;
  pointer in_stack_ffffffffffffffb8;
  sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>
  *in_stack_ffffffffffffffc0;
  dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_38;
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_20;
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_10;
  
  local_10 = in_RSI;
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::size(in_RSI);
  sparsehash_internal::
  sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>::min_buckets
            (in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8,
             (size_type)in_stack_ffffffffffffffb0);
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::clear_to_size(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  local_20 = local_10;
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::begin(in_RDI);
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::end(in_RDI);
  while( true ) {
    bVar1 = dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            ::operator!=(&local_38,(const_iterator *)&stack0xffffffffffffffb0);
    if (!bVar1) break;
    args = dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::operator*(&local_38);
    local_60 = 0;
    sVar2 = dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            ::bucket_count(in_RDI);
    this_00 = (dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)(sVar2 - 1);
    bucknum_00 = get_key<std::pair<int,int>const&>
                           (in_stack_ffffffffffffff78,(pair<int,_int> *)0xb85269);
    sVar2 = hash<std::pair<int,int>>(in_RDI,(pair<int,_int> *)in_stack_ffffffffffffff78);
    local_68 = sVar2 & (ulong)this_00;
    while( true ) {
      bVar1 = dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::test_empty(this_00,(size_type)bucknum_00);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_60 = local_60 + 1;
      local_68 = local_68 + local_60 & (ulong)this_00;
    }
    set_value<std::pair<int,int>const&>
              ((dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                *)in_RDI,in_RDI->table + local_68,args);
    in_RDI->num_elements = in_RDI->num_elements + 1;
    dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator++((dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)in_RDI);
  }
  sparsehash_internal::
  sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>::inc_num_ht_copies
            ((sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4> *)
             in_RDI);
  return;
}

Assistant:

void copy_or_move_from(Hashtable&& ht, size_type min_buckets_wanted) {
    clear_to_size(settings.min_buckets(ht.size(), min_buckets_wanted));

    // We use a normal iterator to get non-deleted bcks from ht
    // We could use insert() here, but since we know there are
    // no duplicates and no deleted items, we can be more efficient
    assert((bucket_count() & (bucket_count() - 1)) == 0);  // a power of two
    for (auto&& value : ht) {
      size_type num_probes = 0;  // how many times we've probed
      size_type bucknum;
      const size_type bucket_count_minus_one = bucket_count() - 1;
      for (bucknum = hash(get_key(value)) & bucket_count_minus_one;
           !test_empty(bucknum);  // not empty
           bucknum =
               (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one) {
        ++num_probes;
        assert(num_probes < bucket_count() &&
               "Hashtable is full: an error in key_equal<> or hash<>");
      }

      using will_move = std::is_rvalue_reference<Hashtable&&>;
      using value_t = typename std::conditional<will_move::value, value_type&&, const_reference>::type;

      set_value(&table[bucknum], std::forward<value_t>(value));
      num_elements++;
    }
    settings.inc_num_ht_copies();
  }